

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O3

void lyext_load_plugins(void)

{
  undefined8 *puVar1;
  int *piVar2;
  int *piVar3;
  lyext_plugin *plVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  DIR *__dirp;
  dirent *pdVar8;
  size_t sVar9;
  void *node;
  undefined8 *puVar10;
  LY_ERR *pLVar11;
  undefined8 uVar12;
  lyext_plugin_list *plVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  char *pcVar18;
  long lVar19;
  char *__name;
  undefined1 auStack_16b [11];
  char name [255];
  undefined8 *local_40;
  char *local_38;
  char *str;
  
  pcVar7 = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
  __name = "/usr/local/lib/libyang";
  if (pcVar7 != (char *)0x0) {
    __name = pcVar7;
  }
  __dirp = opendir(__name);
  if (__dirp == (DIR *)0x0) {
    if ('\0' < ly_log_level) {
      ly_log(LY_LLWRN,"libyang extensions plugins directory \"%s\" does not exist.",__name);
      return;
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ext_lock);
    pdVar8 = readdir(__dirp);
    while (pdVar8 != (dirent *)0x0) {
      if (pdVar8->d_type != '\n') {
        pcVar7 = pdVar8->d_name;
        sVar9 = strlen(pcVar7);
        if ((3 < sVar9) && (iVar6 = strcmp(pcVar7 + (sVar9 - 3),".so"), iVar6 == 0)) {
          memcpy(auStack_16b + 3,pcVar7,sVar9 - 3);
          auStack_16b[sVar9] = 0;
          asprintf(&local_38,"%s/%s",__name,pcVar7);
          node = (void *)dlopen(local_38,6);
          dlerror();
          if (node == (void *)0x0) {
            node = (void *)dlopen(local_38,2);
            if (node == (void *)0x0) {
              pLVar11 = ly_errno_location();
              pcVar7 = local_38;
              *pLVar11 = LY_ESYS;
              uVar12 = dlerror();
              ly_log(LY_LLERR,"Loading \"%s\" as an extension plugin failed (%s).",pcVar7,uVar12);
              free(local_38);
            }
            else {
              if ('\x01' < ly_log_level) {
                ly_log(LY_LLVRB,"Extension plugin \"%s\" successfully loaded.",local_38);
              }
              free(local_38);
              dlerror();
              puVar10 = (undefined8 *)dlsym(node,auStack_16b + 3);
              local_38 = (char *)dlerror();
              uVar5 = ext_plugins_count;
              plVar13 = ext_plugins;
              if (local_38 != (char *)0x0) {
                pLVar11 = ly_errno_location();
                *pLVar11 = LY_ESYS;
                ly_log(LY_LLERR,
                       "Processing \"%s\" extension plugin failed, missing plugin list object (%s)."
                       ,auStack_16b + 3,local_38);
                goto LAB_00163b62;
              }
              pcVar7 = (char *)puVar10[2];
              uVar16 = (ulong)ext_plugins_count;
              if (pcVar7 == (char *)0x0) {
                uVar15 = 0;
              }
              else {
                uVar15 = 0;
                local_40 = puVar10;
                do {
                  unique0x1000071f = uVar15;
                  if (uVar16 != 0) {
                    lVar19 = 0;
                    do {
                      iVar6 = strcmp(pcVar7,*(char **)((long)&plVar13->name + lVar19));
                      if (((iVar6 == 0) &&
                          (iVar6 = strcmp((char *)*local_40,
                                          *(char **)((long)&plVar13->module + lVar19)), iVar6 == 0))
                         && (((char *)local_40[1] == (char *)0x0 ||
                             ((pcVar18 = *(char **)((long)&plVar13->revision + lVar19),
                              pcVar18 == (char *)0x0 ||
                              (iVar6 = strcmp((char *)local_40[1],pcVar18), iVar6 == 0)))))) {
                        pLVar11 = ly_errno_location();
                        *pLVar11 = LY_ESYS;
                        pcVar7 = (char *)local_40[1];
                        pcVar18 = "@";
                        if (pcVar7 == (char *)0x0) {
                          pcVar18 = "";
                          pcVar7 = "";
                        }
                        ly_log(LY_LLERR,
                               "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                               ,auStack_16b + 3,local_40[2],*local_40,pcVar18,pcVar7);
                        goto LAB_00163f07;
                      }
                      lVar19 = lVar19 + 0x20;
                    } while (uVar16 << 5 != lVar19);
                  }
                  piVar2 = (int *)local_40[3];
                  if (((*piVar2 == 1) && (piVar3 = *(int **)(piVar2 + 8), piVar3 != (int *)0x0)) &&
                     (iVar6 = *piVar3, iVar6 != 0)) {
                    uVar14 = 1;
                    uVar15 = 0;
                    piVar17 = piVar3;
                    do {
                      if (((0x37 < iVar6) || (iVar6 == 0x16)) || (iVar6 == 0x13)) {
                        pLVar11 = ly_errno_location();
                        *pLVar11 = LY_EINVAL;
                        uVar12 = local_40[2];
                        pcVar7 = ly_stmt_str[*(int *)(*(long *)(piVar2 + 8) + uVar15 * 0x18)];
                        pcVar18 = 
                        "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
                        ;
LAB_00163ef6:
                        ly_log(LY_LLERR,pcVar18,auStack_16b + 3,uVar12,pcVar7);
LAB_00163f07:
                        dlclose(node);
                        goto LAB_00163b6a;
                      }
                      if ((iVar6 - 0x14U < 7) && (1 < (uint)piVar17[4])) {
                        pLVar11 = ly_errno_location();
                        *pLVar11 = LY_EINVAL;
                        uVar12 = local_40[2];
                        pcVar7 = ly_stmt_str[*(int *)(*(long *)(piVar2 + 8) + uVar15 * 0x18)];
                        pcVar18 = 
                        "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
                        ;
                        goto LAB_00163ef6;
                      }
                      uVar15 = (ulong)uVar14;
                      piVar17 = piVar3 + uVar15 * 6;
                      iVar6 = *piVar17;
                      uVar14 = uVar14 + 1;
                    } while (iVar6 != 0);
                  }
                  uVar15 = (ulong)((int)stack0xffffffffffffff98 + 1);
                  local_40 = puVar10 + uVar15 * 4;
                  pcVar7 = (char *)puVar10[uVar15 * 4 + 2];
                } while (pcVar7 != (char *)0x0);
              }
              plVar13 = (lyext_plugin_list *)realloc(plVar13,(ulong)(uVar5 + (int)uVar15) << 5);
              if (plVar13 == (lyext_plugin_list *)0x0) {
                pLVar11 = ly_errno_location();
                *pLVar11 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyext_load_plugins");
                dlclose(node);
                break;
              }
              ext_plugins = plVar13;
              if ((int)uVar15 != 0) {
                lVar19 = uVar15 << 5;
                do {
                  puVar1 = (undefined8 *)((long)puVar10 + lVar19 + -0x20);
                  pcVar7 = (char *)*puVar1;
                  pcVar18 = (char *)puVar1[1];
                  puVar1 = (undefined8 *)((long)puVar10 + lVar19 + -0x10);
                  plVar4 = (lyext_plugin *)puVar1[1];
                  plVar13[ext_plugins_count].name = (char *)*puVar1;
                  (&plVar13[ext_plugins_count].name)[1] = (char *)plVar4;
                  plVar13[ext_plugins_count].module = pcVar7;
                  plVar13[ext_plugins_count].revision = pcVar18;
                  ext_plugins_count = ext_plugins_count + 1;
                  lVar19 = lVar19 + -0x20;
                } while (lVar19 != 0);
              }
              ly_set_add(&dlhandlers,node,1);
            }
          }
          else {
            if ('\x01' < ly_log_level) {
              ly_log(LY_LLVRB,"Extension plugin \"%s\" already loaded.",local_38);
            }
            free(local_38);
LAB_00163b62:
            dlclose(node);
          }
        }
      }
LAB_00163b6a:
      pdVar8 = readdir(__dirp);
    }
    closedir(__dirp);
    pthread_mutex_unlock((pthread_mutex_t *)&ext_lock);
  }
  return;
}

Assistant:

API void
lyext_load_plugins(void)
{
    DIR* dir;
    struct dirent *file;
    size_t len;
    char *str;
    char name[NAME_MAX];
    void *dlhandler;
    struct lyext_plugin_list *plugin, *p;
    struct lyext_plugin_complex *pluginc;
    unsigned int u, v;
    const char *pluginsdir;

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LYEXT_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no plugins */
        LOGWRN("libyang extensions plugins directory \"%s\" does not exist.", pluginsdir);
        return;
    }

    /* lock the extension plugins list */
    pthread_mutex_lock(&ext_lock);

    while ((file = readdir(dir))) {
        if (file->d_type != DT_REG && file->d_type == DT_LNK) {
            /* other files than regular and symbolic links are ignored */
            continue;
        }

        /* required format of the filename is *LYEXT_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LYEXT_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LYEXT_PLUGIN_SUFFIX_LEN], LYEXT_PLUGIN_SUFFIX)) {
            continue;
        }

        /* store the name without the suffix */
        memcpy(name, file->d_name, len - LYEXT_PLUGIN_SUFFIX_LEN);
        name[len - LYEXT_PLUGIN_SUFFIX_LEN] = '\0';

        /* and construct the filepath */
        asprintf(&str, "%s/%s", pluginsdir, file->d_name);

        /* load the plugin - first, try if it is already loaded... */
        dlhandler = dlopen(str, RTLD_NOW | RTLD_NOLOAD);
        dlerror();    /* Clear any existing error */
        if (dlhandler) {
            /* the plugin is already loaded */
            LOGVRB("Extension plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }

        /* ... and if not, load it */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(LY_ESYS, "Loading \"%s\" as an extension plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        LOGVRB("Extension plugin \"%s\" successfully loaded.", str);
        free(str);
        dlerror();    /* Clear any existing error */

        /* get the plugin data */
        plugin = dlsym(dlhandler, name);
        str = dlerror();
        if (str) {
            LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed, missing plugin list object (%s).", name, str);
            dlclose(dlhandler);
            continue;
        }

        for(u = 0; plugin[u].name; u++) {
            /* check extension implementations for collisions */
            for (v = 0; v < ext_plugins_count; v++) {
                if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                        !strcmp(plugin[u].module, ext_plugins[v].module) &&
                        (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                    LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed,"
                           "implementation collision for extension %s from module %s%s%s.",
                           name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                           plugin[u].revision ? plugin[u].revision : "");
                    dlclose(dlhandler);
                    goto nextplugin;
                }
            }

            /* check for valid supported substatements in case of complex extension */
            if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
                pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
                for (v = 0; pluginc->substmt[v].stmt; v++) {
                    if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                            pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                            pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                        LOGERR(LY_EINVAL,
                               "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                    if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                             pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                             pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                        LOGERR(LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                               "substatement, which is not supported.",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                }
            }
        }


        /* add the new plugins, we have number of new plugins as u */
        p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
        if (!p) {
            LOGMEM;
            dlclose(dlhandler);
            closedir(dir);

            /* unlock the global structures */
            pthread_mutex_unlock(&ext_lock);

            return;
        }
        ext_plugins = p;
        for( ; u; u--) {
            memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
            ext_plugins_count++;
        }

        /* keep the handler */
        ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);

nextplugin:;
    }

    closedir(dir);

    /* unlock the global structures */
    pthread_mutex_unlock(&ext_lock);
}